

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O2

float __thiscall
draco::DracoOptions<int>::GetAttributeFloat
          (DracoOptions<int> *this,AttributeKey *att_key,string *name,float default_val)

{
  bool bVar1;
  DracoOptions<int> *this_00;
  float fVar2;
  
  this_00 = (DracoOptions<int> *)FindAttributeOptions(this,att_key);
  if (this_00 != (DracoOptions<int> *)0x0) {
    bVar1 = Options::IsOptionSet((Options *)this_00,name);
    if (bVar1) goto LAB_0015b00a;
  }
  this_00 = this;
LAB_0015b00a:
  fVar2 = Options::GetFloat(&this_00->global_options_,name,default_val);
  return fVar2;
}

Assistant:

float DracoOptions<AttributeKeyT>::GetAttributeFloat(
    const AttributeKeyT &att_key, const std::string &name,
    float default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetFloat(name, default_val);
  }
  return global_options_.GetFloat(name, default_val);
}